

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O2

size_t __thiscall
google::protobuf::DescriptorProto_ExtensionRange::ByteSizeLong(DescriptorProto_ExtensionRange *this)

{
  uint uVar1;
  size_t sVar2;
  size_t sVar3;
  
  uVar1 = (this->_has_bits_).has_bits_[0];
  if ((uVar1 & 7) == 0) {
    sVar3 = 0;
  }
  else {
    if ((uVar1 & 1) == 0) {
      sVar3 = 0;
    }
    else {
      sVar3 = internal::WireFormatLite::MessageSize<google::protobuf::ExtensionRangeOptions>
                        (this->options_);
      sVar3 = sVar3 + 1;
    }
    if ((uVar1 & 2) != 0) {
      sVar2 = io::CodedOutputStream::VarintSize32SignExtended(this->start_);
      sVar3 = sVar3 + sVar2 + 1;
    }
    if ((uVar1 & 4) != 0) {
      sVar2 = io::CodedOutputStream::VarintSize32SignExtended(this->end_);
      sVar3 = sVar3 + sVar2 + 1;
    }
  }
  if (((ulong)(this->_internal_metadata_).
              super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
              .ptr_ & 1) == 0) {
    (this->_cached_size_).size_.super___atomic_base<int>._M_i = (__int_type_conflict)sVar3;
    return sVar3;
  }
  sVar3 = internal::ComputeUnknownFieldsSize(&this->_internal_metadata_,sVar3,&this->_cached_size_);
  return sVar3;
}

Assistant:

size_t DescriptorProto_ExtensionRange::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:google.protobuf.DescriptorProto.ExtensionRange)
  size_t total_size = 0;

  ::PROTOBUF_NAMESPACE_ID::uint32 cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  cached_has_bits = _has_bits_[0];
  if (cached_has_bits & 0x00000007u) {
    // optional .google.protobuf.ExtensionRangeOptions options = 3;
    if (cached_has_bits & 0x00000001u) {
      total_size += 1 +
        ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::MessageSize(
          *options_);
    }

    // optional int32 start = 1;
    if (cached_has_bits & 0x00000002u) {
      total_size += 1 +
        ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::Int32Size(
          this->_internal_start());
    }

    // optional int32 end = 2;
    if (cached_has_bits & 0x00000004u) {
      total_size += 1 +
        ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::Int32Size(
          this->_internal_end());
    }

  }
  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    return ::PROTOBUF_NAMESPACE_ID::internal::ComputeUnknownFieldsSize(
        _internal_metadata_, total_size, &_cached_size_);
  }
  int cached_size = ::PROTOBUF_NAMESPACE_ID::internal::ToCachedSize(total_size);
  SetCachedSize(cached_size);
  return total_size;
}